

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::Execute_CreateErrorHelper
               (JsRTSingleVarArgumentAction *errorData,ThreadContextTTD *executeContext,
               ScriptContext *ctx,EventKind eventKind,Var *res)

{
  Var aValue;
  RecyclableObject *value;
  JavascriptError *instance;
  
  aValue = InflateVarInReplay(executeContext,errorData->VarArray[0]);
  if (aValue != (Var)0x0) {
    if (((ulong)aValue >> 0x30 == 0) &&
       (value = Js::VarTo<Js::RecyclableObject>(aValue),
       (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
       ptr != ctx)) {
      aValue = Js::CrossSite::MarshalVar(ctx,value,false);
    }
    *res = (Var)0x0;
    switch(eventKind) {
    case CreateErrorActionTag:
      instance = Js::JavascriptLibrary::CreateError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    case CreateRangeErrorActionTag:
      instance = Js::JavascriptLibrary::CreateRangeError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    case CreateReferenceErrorActionTag:
      instance = Js::JavascriptLibrary::CreateReferenceError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    case CreateSyntaxErrorActionTag:
      instance = Js::JavascriptLibrary::CreateSyntaxError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    case CreateTypeErrorActionTag:
      instance = Js::JavascriptLibrary::CreateTypeError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    case CreateURIErrorActionTag:
      instance = Js::JavascriptLibrary::CreateURIError
                           ((ctx->super_ScriptContextBase).javascriptLibrary);
      break;
    default:
      TTDAbort_unrecoverable_error("Missing error kind!!!");
    }
    *res = instance;
    Js::JavascriptOperators::OP_SetProperty
              (instance,0x102,aValue,ctx,(PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
  }
  return;
}

Assistant:

void Execute_CreateErrorHelper(const JsRTSingleVarArgumentAction* errorData, ThreadContextTTD* executeContext, Js::ScriptContext* ctx, EventKind eventKind, Js::Var* res)
        {
            Js::Var message = InflateVarInReplay(executeContext, GetVarItem_0(errorData));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(message, ctx);

            *res = nullptr;
            switch(eventKind)
            {
            case EventKind::CreateErrorActionTag:
                *res = ctx->GetLibrary()->CreateError();
                break;
            case EventKind::CreateRangeErrorActionTag:
                *res = ctx->GetLibrary()->CreateRangeError();
                break;
            case EventKind::CreateReferenceErrorActionTag:
                *res = ctx->GetLibrary()->CreateReferenceError();
                break;
            case EventKind::CreateSyntaxErrorActionTag:
                *res = ctx->GetLibrary()->CreateSyntaxError();
                break;
            case EventKind::CreateTypeErrorActionTag:
                *res = ctx->GetLibrary()->CreateTypeError();
                break;
            case EventKind::CreateURIErrorActionTag:
                *res = ctx->GetLibrary()->CreateURIError();
                break;
            default:
                TTDAssert(false, "Missing error kind!!!");
            }

            Js::JavascriptOperators::OP_SetProperty(*res, Js::PropertyIds::message, message, ctx);
        }